

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall DLevelScript::SideFromID(DLevelScript *this,int id,int side)

{
  int iVar1;
  side_t *psVar2;
  int iVar3;
  FLineIdIterator local_18;
  
  iVar3 = -1;
  if ((uint)side < 2) {
    if (id == 0) {
      if (this->activationline == (line_t *)0x0) {
        return -1;
      }
      psVar2 = this->activationline->sidedef[(uint)side];
    }
    else {
      local_18.start = tagManager.IDHashFirst[id & 0xff];
      local_18.searchtag = id;
      iVar1 = FLineIdIterator::Next(&local_18);
      if (iVar1 == -1) {
        return -1;
      }
      psVar2 = lines[iVar1].sidedef[(uint)side];
    }
    if (psVar2 != (side_t *)0x0) {
      iVar3 = psVar2->Index;
    }
  }
  return iVar3;
}

Assistant:

int DLevelScript::SideFromID(int id, int side)
{
	if (side != 0 && side != 1) return -1;
	
	if (id == 0)
	{
		if (activationline == NULL) return -1;
		if (activationline->sidedef[side] == NULL) return -1;
		return activationline->sidedef[side]->Index;
	}
	else
	{
		int line = P_FindFirstLineFromID(id);
		if (line == -1) return -1;
		if (lines[line].sidedef[side] == NULL) return -1;
		return lines[line].sidedef[side]->Index;
	}
}